

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O2

OneofOptions *
google::protobuf::compiler::StripLocalSourceRetentionOptions
          (OneofOptions *__return_storage_ptr__,OneofDescriptor *descriptor)

{
  OneofOptions options;
  OneofOptions OStack_68;
  
  OneofOptions::OneofOptions(&OStack_68,descriptor->options_);
  anon_unknown_0::ConvertToDynamicMessageAndStripOptions
            (&OStack_68.super_Message,descriptor->containing_type_->file_->pool_,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x0);
  OneofOptions::OneofOptions(__return_storage_ptr__,&OStack_68);
  OneofOptions::~OneofOptions(&OStack_68);
  return __return_storage_ptr__;
}

Assistant:

OneofOptions StripLocalSourceRetentionOptions(
    const OneofDescriptor& descriptor) {
  return StripLocalOptions(descriptor);
}